

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

_Bool ConnectionExists(Curl_easy *data,connectdata *needle,connectdata **usethis,_Bool *force_reuse,
                      _Bool *waitpipe)

{
  uchar uVar1;
  size_t sVar2;
  bool bVar3;
  _Bool _Var4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  connectbundle *pcVar8;
  Curl_handler *pCVar9;
  uint uVar10;
  char *pcVar11;
  uint uVar12;
  size_t sVar13;
  bool bVar14;
  Curl_llist_element *pCVar15;
  connectdata *conn;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  connectdata *local_78;
  
  bVar16 = true;
  if ((((needle->handler->protocol & 3) != 0) &&
      ((~*(uint *)&(needle->bits).field_0x4 & 0x4040) != 0)) &&
     (_Var4 = Curl_multiplex_wanted(data->multi), _Var4)) {
    bVar16 = (data->state).httpwant < 3;
  }
  if (((data->state).authhost.want & 0x28) == 0) {
    bVar17 = false;
  }
  else {
    bVar17 = (needle->handler->protocol & 3) != 0;
  }
  if ((((needle->bits).field_0x4 & 4) == 0) || (((data->state).authproxy.want & 0x28) == 0)) {
    bVar18 = false;
  }
  else {
    bVar18 = (needle->handler->protocol & 3) != 0;
  }
  bVar14 = false;
  *force_reuse = false;
  *waitpipe = false;
  pcVar8 = Curl_conncache_find_bundle(data,needle,(data->state).conn_cache);
  if (pcVar8 != (connectbundle *)0x0) {
    pcVar11 = "serially";
    if (pcVar8->multiuse == 2) {
      pcVar11 = "can multiplex";
    }
    bVar3 = false;
    Curl_infof(data,"Found bundle for host: %p [%s]",pcVar8,pcVar11);
    if (!bVar16) {
      iVar6 = pcVar8->multiuse;
      bVar3 = true;
      if (iVar6 == 0) {
        if (((data->set).field_0x8e7 & 4) != 0) {
          Curl_infof(data,"Server doesn\'t support multiplex yet, wait");
          *waitpipe = true;
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
            return false;
          }
          return false;
        }
        bVar3 = false;
        Curl_infof(data,"Server doesn\'t support multiplex (yet)");
        iVar6 = pcVar8->multiuse;
      }
      if ((iVar6 == 2) && (_Var4 = Curl_multiplex_wanted(data->multi), !_Var4)) {
        bVar3 = false;
        Curl_infof(data,"Could multiplex, but not asked to");
      }
      if (pcVar8->multiuse == -1) {
        bVar3 = false;
        Curl_infof(data,"Can not multiplex, even if we wanted to");
      }
    }
    pCVar15 = (pcVar8->conn_list).head;
    if (pCVar15 == (Curl_llist_element *)0x0) {
      bVar14 = false;
    }
    else {
      local_78 = (connectdata *)0x0;
      bVar14 = false;
      do {
        conn = (connectdata *)pCVar15->ptr;
        pCVar15 = pCVar15->next;
        if ((conn->connect_only == '\0') && (((conn->bits).field_0x4 & 0x40) == 0)) {
          _Var4 = extract_if_dead(conn,data);
          if (_Var4) {
            Curl_disconnect(data,conn,true);
          }
          else {
            uVar1 = (data->set).ipver;
            if ((uVar1 == '\0') || (uVar1 == conn->ip_version)) {
              if (pcVar8->multiuse == 2) {
                sVar13 = (conn->easyq).size;
                bVar16 = true;
                if (!bVar3) {
                  if (sVar13 == 0) goto LAB_0053b5a5;
                  goto LAB_0053b696;
                }
LAB_0053b5b9:
                if (((conn->handler->flags ^ needle->handler->flags) & 1) == 0) {
                  uVar7 = *(uint *)&(conn->bits).field_0x4;
                }
                else if ((conn->handler->family != needle->handler->protocol) ||
                        (uVar7 = *(uint *)&(conn->bits).field_0x4, (uVar7 >> 0x1c & 1) == 0))
                goto LAB_0053b696;
                uVar5 = *(uint *)&(needle->bits).field_0x4;
                uVar10 = uVar7 ^ uVar5;
                if (((uVar10 & 1) == 0) &&
                   (uVar12 = uVar5 >> 1 & 1, uVar12 == ((uVar7 >> 1 & 1) != 0))) {
                  if (uVar12 != 0) {
                    _Var4 = proxy_info_matches(&needle->socks_proxy,&conn->socks_proxy);
                    if (((!_Var4) ||
                        (iVar6 = Curl_timestrcmp((needle->socks_proxy).user,(conn->socks_proxy).user
                                                ), iVar6 != 0)) ||
                       (iVar6 = Curl_timestrcmp((needle->socks_proxy).passwd,
                                                (conn->socks_proxy).passwd), iVar6 != 0))
                    goto LAB_0053b696;
                    uVar5 = *(uint *)&(needle->bits).field_0x4;
                    uVar10 = *(uint *)&(conn->bits).field_0x4 ^ uVar5;
                  }
                  if (((uVar10 & 0x600) == 0) &&
                     (((uVar5 & 1) == 0 ||
                      (((_Var4 = proxy_info_matches(&needle->http_proxy,&conn->http_proxy), _Var4 &&
                        (((*(uint *)&(conn->bits).field_0x4 ^ *(uint *)&(needle->bits).field_0x4) &
                         8) == 0)) &&
                       (((needle->http_proxy).proxytype != '\x02' ||
                        ((((needle->handler->flags & 1) == 0 ||
                          ((_Var4 = Curl_ssl_config_matches
                                              (&needle->proxy_ssl_config,&conn->proxy_ssl_config),
                           _Var4 && (conn->proxy_ssl[0].state == ssl_connection_complete)))) &&
                         ((_Var4 = Curl_ssl_config_matches(&needle->ssl_config,&conn->ssl_config),
                          _Var4 && (conn->ssl[0].state == ssl_connection_complete)))))))))))) {
                    sVar2 = (conn->easyq).size;
                    if (bVar16) {
                      if ((sVar2 == 0) ||
                         (*(Curl_multi **)((long)((conn->easyq).head)->ptr + 0xb8) == data->multi))
                      {
LAB_0053b7b4:
                        pcVar11 = needle->localdev;
                        if ((pcVar11 == (char *)0x0 && needle->localport == 0) ||
                           (((conn->localport == needle->localport &&
                             (conn->localportrange == needle->localportrange)) &&
                            ((pcVar11 == (char *)0x0 ||
                             ((conn->localdev != (char *)0x0 &&
                              (iVar6 = strcmp(conn->localdev,pcVar11), iVar6 == 0)))))))) {
                          pCVar9 = needle->handler;
                          if ((pCVar9->flags & 0x80) == 0) {
                            iVar6 = Curl_timestrcmp(needle->user,conn->user);
                            if ((((iVar6 != 0) ||
                                 (iVar6 = Curl_timestrcmp(needle->passwd,conn->passwd), iVar6 != 0))
                                || (iVar6 = Curl_timestrcmp(needle->sasl_authzid,conn->sasl_authzid)
                                   , iVar6 != 0)) ||
                               (iVar6 = Curl_timestrcmp(needle->oauth_bearer,conn->oauth_bearer),
                               iVar6 != 0)) goto LAB_0053b696;
                            pCVar9 = needle->handler;
                          }
                          if (((((pCVar9->protocol & 3) == 0) || (conn->httpversion < 0x14)) ||
                              (2 < (data->state).httpwant)) && (pCVar9->family != 0x30)) {
                            if (((pCVar9->flags & 1) == 0) &&
                               ((*(uint *)&(needle->bits).field_0x4 & 9) == 1)) goto LAB_0053b8c9;
                            iVar6 = Curl_strcasecompare(pCVar9->scheme,conn->handler->scheme);
                            if ((iVar6 != 0) ||
                               ((conn->handler->family == needle->handler->protocol &&
                                (((conn->bits).field_0x7 & 0x10) != 0)))) {
                              uVar7 = *(uint *)&(needle->bits).field_0x4;
                              if ((uVar7 >> 9 & 1) != 0) {
                                iVar6 = Curl_strcasecompare((needle->conn_to_host).name,
                                                            (conn->conn_to_host).name);
                                if (iVar6 == 0) goto LAB_0053b696;
                                uVar7 = *(uint *)&(needle->bits).field_0x4;
                              }
                              if (((((uVar7 >> 10 & 1) == 0) ||
                                   (needle->conn_to_port == conn->conn_to_port)) &&
                                  (iVar6 = Curl_strcasecompare((needle->host).name,(conn->host).name
                                                              ), iVar6 != 0)) &&
                                 (needle->remote_port == conn->remote_port)) {
                                if ((needle->handler->flags & 1) != 0) {
                                  _Var4 = Curl_ssl_config_matches
                                                    (&needle->ssl_config,&conn->ssl_config);
                                  if (!_Var4) goto LAB_0053b696;
                                  if (conn->ssl[0].state != ssl_connection_complete)
                                  goto LAB_0053b693;
                                }
LAB_0053b8c9:
                                if (bVar17) {
                                  iVar6 = Curl_timestrcmp(needle->user,conn->user);
                                  if ((iVar6 == 0) &&
                                     (iVar6 = Curl_timestrcmp(needle->passwd,conn->passwd),
                                     iVar6 == 0)) {
LAB_0053bac1:
                                    if (bVar18) {
                                      pcVar11 = (conn->http_proxy).user;
                                      if (((pcVar11 != (char *)0x0) &&
                                          ((conn->http_proxy).passwd != (char *)0x0)) &&
                                         ((iVar6 = Curl_timestrcmp((needle->http_proxy).user,pcVar11
                                                                  ), iVar6 == 0 &&
                                          (iVar6 = Curl_timestrcmp((needle->http_proxy).passwd,
                                                                   (conn->http_proxy).passwd),
                                          iVar6 == 0)))) {
LAB_0053bb2c:
                                        if (((bVar17) && (conn->http_ntlm_state != NTLMSTATE_NONE))
                                           || ((local_78 = conn, bVar18 &&
                                               (conn->proxy_ntlm_state != NTLMSTATE_NONE)))) {
                                          *force_reuse = true;
                                          goto LAB_0053bbde;
                                        }
                                      }
                                    }
                                    else if (conn->proxy_ntlm_state == NTLMSTATE_NONE) {
                                      if (bVar17) goto LAB_0053bb2c;
                                      if (!(bool)(bVar16 & sVar13 != 0)) goto LAB_0053bbde;
                                      if (((conn->bits).field_0x7 & 1) == 0) {
LAB_0053bc9a:
                                        Curl_infof(data,"Multiplexed connection found");
                                        goto LAB_0053bbde;
                                      }
                                      if (sVar13 < (conn->proto).httpc.settings.
                                                   max_concurrent_streams) {
                                        uVar7 = Curl_multi_max_concurrent_streams(data->multi);
                                        if (sVar13 < uVar7) goto LAB_0053bc9a;
                                        pcVar11 = 
                                        "client side MAX_CONCURRENT_STREAMS reached, skip (%zu)";
                                      }
                                      else {
                                        pcVar11 = "MAX_CONCURRENT_STREAMS reached, skip (%zu)";
                                      }
                                      Curl_infof(data,pcVar11,sVar13);
                                    }
                                  }
                                  else if (conn->http_ntlm_state == NTLMSTATE_NONE) {
                                    local_78 = conn;
                                  }
                                }
                                else if (conn->http_ntlm_state == NTLMSTATE_NONE) goto LAB_0053bac1;
                              }
                            }
                          }
                        }
                      }
                    }
                    else if (sVar2 == 0) goto LAB_0053b7b4;
                  }
                }
              }
              else {
                if (bVar3) {
                  bVar16 = true;
LAB_0053b5b6:
                  sVar13 = 0;
                  goto LAB_0053b5b9;
                }
LAB_0053b5a5:
                if (conn->sock[0] != -1) {
                  bVar16 = false;
                  goto LAB_0053b5b6;
                }
                Curl_infof(data,"Connection #%ld isn\'t open enough, can\'t reuse",
                           conn->connection_id);
LAB_0053b693:
                bVar14 = true;
              }
            }
          }
        }
LAB_0053b696:
      } while (pCVar15 != (Curl_llist_element *)0x0);
      conn = local_78;
      if (local_78 != (connectdata *)0x0) {
LAB_0053bbde:
        Curl_attach_connection(data,conn);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
        }
        *usethis = conn;
        return true;
      }
    }
  }
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
  }
  if ((bVar14) && (((data->set).field_0x8e7 & 4) != 0)) {
    Curl_infof(data,"Found pending candidate for reuse and CURLOPT_PIPEWAIT is set");
    *waitpipe = true;
    return false;
  }
  return false;
}

Assistant:

static bool
ConnectionExists(struct Curl_easy *data,
                 struct connectdata *needle,
                 struct connectdata **usethis,
                 bool *force_reuse,
                 bool *waitpipe)
{
  struct connectdata *check;
  struct connectdata *chosen = 0;
  bool foundPendingCandidate = FALSE;
  bool canmultiplex = IsMultiplexingPossible(data, needle);
  struct connectbundle *bundle;

#ifdef USE_NTLM
  bool wantNTLMhttp = ((data->state.authhost.want &
                        (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
                       (needle->handler->protocol & PROTO_FAMILY_HTTP));
#ifndef CURL_DISABLE_PROXY
  bool wantProxyNTLMhttp = (needle->bits.proxy_user_passwd &&
                            ((data->state.authproxy.want &
                              (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
                             (needle->handler->protocol & PROTO_FAMILY_HTTP)));
#else
  bool wantProxyNTLMhttp = FALSE;
#endif
#endif

  *force_reuse = FALSE;
  *waitpipe = FALSE;

  /* Look up the bundle with all the connections to this particular host.
     Locks the connection cache, beware of early returns! */
  bundle = Curl_conncache_find_bundle(data, needle, data->state.conn_cache);
  if(bundle) {
    /* Max pipe length is zero (unlimited) for multiplexed connections */
    struct Curl_llist_element *curr;

    infof(data, "Found bundle for host: %p [%s]",
          (void *)bundle, (bundle->multiuse == BUNDLE_MULTIPLEX ?
                           "can multiplex" : "serially"));

    /* We can't multiplex if we don't know anything about the server */
    if(canmultiplex) {
      if(bundle->multiuse == BUNDLE_UNKNOWN) {
        if(data->set.pipewait) {
          infof(data, "Server doesn't support multiplex yet, wait");
          *waitpipe = TRUE;
          CONNCACHE_UNLOCK(data);
          return FALSE; /* no re-use */
        }

        infof(data, "Server doesn't support multiplex (yet)");
        canmultiplex = FALSE;
      }
      if((bundle->multiuse == BUNDLE_MULTIPLEX) &&
         !Curl_multiplex_wanted(data->multi)) {
        infof(data, "Could multiplex, but not asked to");
        canmultiplex = FALSE;
      }
      if(bundle->multiuse == BUNDLE_NO_MULTIUSE) {
        infof(data, "Can not multiplex, even if we wanted to");
        canmultiplex = FALSE;
      }
    }

    curr = bundle->conn_list.head;
    while(curr) {
      bool match = FALSE;
      size_t multiplexed = 0;

      /*
       * Note that if we use a HTTP proxy in normal mode (no tunneling), we
       * check connections to that proxy and not to the actual remote server.
       */
      check = curr->ptr;
      curr = curr->next;

      if(check->connect_only || check->bits.close)
        /* connect-only or to-be-closed connections will not be reused */
        continue;

      if(extract_if_dead(check, data)) {
        /* disconnect it */
        Curl_disconnect(data, check, TRUE);
        continue;
      }

      if(data->set.ipver != CURL_IPRESOLVE_WHATEVER
          && data->set.ipver != check->ip_version) {
        /* skip because the connection is not via the requested IP version */
        continue;
      }

      if(bundle->multiuse == BUNDLE_MULTIPLEX)
        multiplexed = CONN_INUSE(check);

      if(!canmultiplex) {
        if(multiplexed) {
          /* can only happen within multi handles, and means that another easy
             handle is using this connection */
          continue;
        }

        if(Curl_resolver_asynch()) {
          /* primary_ip[0] is NUL only if the resolving of the name hasn't
             completed yet and until then we don't re-use this connection */
          if(!check->primary_ip[0]) {
            infof(data,
                  "Connection #%ld is still name resolving, can't reuse",
                  check->connection_id);
            continue;
          }
        }

        if(check->sock[FIRSTSOCKET] == CURL_SOCKET_BAD) {
          foundPendingCandidate = TRUE;
          /* Don't pick a connection that hasn't connected yet */
          infof(data, "Connection #%ld isn't open enough, can't reuse",
                check->connection_id);
          continue;
        }
      }

#ifdef USE_UNIX_SOCKETS
      if(needle->unix_domain_socket) {
        if(!check->unix_domain_socket)
          continue;
        if(strcmp(needle->unix_domain_socket, check->unix_domain_socket))
          continue;
        if(needle->bits.abstract_unix_socket !=
           check->bits.abstract_unix_socket)
          continue;
      }
      else if(check->unix_domain_socket)
        continue;
#endif

      if((needle->handler->flags&PROTOPT_SSL) !=
         (check->handler->flags&PROTOPT_SSL))
        /* don't do mixed SSL and non-SSL connections */
        if(get_protocol_family(check->handler) !=
           needle->handler->protocol || !check->bits.tls_upgraded)
          /* except protocols that have been upgraded via TLS */
          continue;

#ifndef CURL_DISABLE_PROXY
      if(needle->bits.httpproxy != check->bits.httpproxy ||
         needle->bits.socksproxy != check->bits.socksproxy)
        continue;

      if(needle->bits.socksproxy &&
        !socks_proxy_info_matches(&needle->socks_proxy,
                                  &check->socks_proxy))
        continue;
#endif
      if(needle->bits.conn_to_host != check->bits.conn_to_host)
        /* don't mix connections that use the "connect to host" feature and
         * connections that don't use this feature */
        continue;

      if(needle->bits.conn_to_port != check->bits.conn_to_port)
        /* don't mix connections that use the "connect to port" feature and
         * connections that don't use this feature */
        continue;

#ifndef CURL_DISABLE_PROXY
      if(needle->bits.httpproxy) {
        if(!proxy_info_matches(&needle->http_proxy, &check->http_proxy))
          continue;

        if(needle->bits.tunnel_proxy != check->bits.tunnel_proxy)
          continue;

        if(needle->http_proxy.proxytype == CURLPROXY_HTTPS) {
          /* use https proxy */
          if(needle->handler->flags&PROTOPT_SSL) {
            /* use double layer ssl */
            if(!Curl_ssl_config_matches(&needle->proxy_ssl_config,
                                        &check->proxy_ssl_config))
              continue;
            if(check->proxy_ssl[FIRSTSOCKET].state != ssl_connection_complete)
              continue;
          }

          if(!Curl_ssl_config_matches(&needle->ssl_config,
                                      &check->ssl_config))
            continue;
          if(check->ssl[FIRSTSOCKET].state != ssl_connection_complete)
            continue;
        }
      }
#endif

      if(!canmultiplex && CONN_INUSE(check))
        /* this request can't be multiplexed but the checked connection is
           already in use so we skip it */
        continue;

      if(CONN_INUSE(check)) {
        /* Subject for multiplex use if 'checks' belongs to the same multi
           handle as 'data' is. */
        struct Curl_llist_element *e = check->easyq.head;
        struct Curl_easy *entry = e->ptr;
        if(entry->multi != data->multi)
          continue;
      }

      if(needle->localdev || needle->localport) {
        /* If we are bound to a specific local end (IP+port), we must not
           re-use a random other one, although if we didn't ask for a
           particular one we can reuse one that was bound.

           This comparison is a bit rough and too strict. Since the input
           parameters can be specified in numerous ways and still end up the
           same it would take a lot of processing to make it really accurate.
           Instead, this matching will assume that re-uses of bound connections
           will most likely also re-use the exact same binding parameters and
           missing out a few edge cases shouldn't hurt anyone very much.
        */
        if((check->localport != needle->localport) ||
           (check->localportrange != needle->localportrange) ||
           (needle->localdev &&
            (!check->localdev || strcmp(check->localdev, needle->localdev))))
          continue;
      }

      if(!(needle->handler->flags & PROTOPT_CREDSPERREQUEST)) {
        /* This protocol requires credentials per connection,
           so verify that we're using the same name and password as well */
        if(Curl_timestrcmp(needle->user, check->user) ||
           Curl_timestrcmp(needle->passwd, check->passwd) ||
           Curl_timestrcmp(needle->sasl_authzid, check->sasl_authzid) ||
           Curl_timestrcmp(needle->oauth_bearer, check->oauth_bearer)) {
          /* one of them was different */
          continue;
        }
      }

      /* If multiplexing isn't enabled on the h2 connection and h1 is
         explicitly requested, handle it: */
      if((needle->handler->protocol & PROTO_FAMILY_HTTP) &&
         (check->httpversion >= 20) &&
         (data->state.httpwant < CURL_HTTP_VERSION_2_0))
        continue;

      if(get_protocol_family(needle->handler) == PROTO_FAMILY_SSH) {
        if(!ssh_config_matches(needle, check))
          continue;
      }

      if((needle->handler->flags&PROTOPT_SSL)
#ifndef CURL_DISABLE_PROXY
         || !needle->bits.httpproxy || needle->bits.tunnel_proxy
#endif
        ) {
        /* The requested connection does not use a HTTP proxy or it uses SSL or
           it is a non-SSL protocol tunneled or it is a non-SSL protocol which
           is allowed to be upgraded via TLS */

        if((strcasecompare(needle->handler->scheme, check->handler->scheme) ||
            (get_protocol_family(check->handler) ==
             needle->handler->protocol && check->bits.tls_upgraded)) &&
           (!needle->bits.conn_to_host || strcasecompare(
            needle->conn_to_host.name, check->conn_to_host.name)) &&
           (!needle->bits.conn_to_port ||
             needle->conn_to_port == check->conn_to_port) &&
           strcasecompare(needle->host.name, check->host.name) &&
           needle->remote_port == check->remote_port) {
          /* The schemes match or the protocol family is the same and the
             previous connection was TLS upgraded, and the hostname and host
             port match */
          if(needle->handler->flags & PROTOPT_SSL) {
            /* This is a SSL connection so verify that we're using the same
               SSL options as well */
            if(!Curl_ssl_config_matches(&needle->ssl_config,
                                        &check->ssl_config)) {
              DEBUGF(infof(data,
                           "Connection #%ld has different SSL parameters, "
                           "can't reuse",
                           check->connection_id));
              continue;
            }
            if(check->ssl[FIRSTSOCKET].state != ssl_connection_complete) {
              foundPendingCandidate = TRUE;
              DEBUGF(infof(data,
                           "Connection #%ld has not started SSL connect, "
                           "can't reuse",
                           check->connection_id));
              continue;
            }
          }
          match = TRUE;
        }
      }
      else {
        /* The requested connection is using the same HTTP proxy in normal
           mode (no tunneling) */
        match = TRUE;
      }

      if(match) {
#if defined(USE_NTLM)
        /* If we are looking for an HTTP+NTLM connection, check if this is
           already authenticating with the right credentials. If not, keep
           looking so that we can reuse NTLM connections if
           possible. (Especially we must not reuse the same connection if
           partway through a handshake!) */
        if(wantNTLMhttp) {
          if(Curl_timestrcmp(needle->user, check->user) ||
             Curl_timestrcmp(needle->passwd, check->passwd)) {

            /* we prefer a credential match, but this is at least a connection
               that can be reused and "upgraded" to NTLM */
            if(check->http_ntlm_state == NTLMSTATE_NONE)
              chosen = check;
            continue;
          }
        }
        else if(check->http_ntlm_state != NTLMSTATE_NONE) {
          /* Connection is using NTLM auth but we don't want NTLM */
          continue;
        }

#ifndef CURL_DISABLE_PROXY
        /* Same for Proxy NTLM authentication */
        if(wantProxyNTLMhttp) {
          /* Both check->http_proxy.user and check->http_proxy.passwd can be
           * NULL */
          if(!check->http_proxy.user || !check->http_proxy.passwd)
            continue;

          if(Curl_timestrcmp(needle->http_proxy.user,
                             check->http_proxy.user) ||
             Curl_timestrcmp(needle->http_proxy.passwd,
                             check->http_proxy.passwd))
            continue;
        }
        else if(check->proxy_ntlm_state != NTLMSTATE_NONE) {
          /* Proxy connection is using NTLM auth but we don't want NTLM */
          continue;
        }
#endif
        if(wantNTLMhttp || wantProxyNTLMhttp) {
          /* Credentials are already checked, we can use this connection */
          chosen = check;

          if((wantNTLMhttp &&
             (check->http_ntlm_state != NTLMSTATE_NONE)) ||
              (wantProxyNTLMhttp &&
               (check->proxy_ntlm_state != NTLMSTATE_NONE))) {
            /* We must use this connection, no other */
            *force_reuse = TRUE;
            break;
          }

          /* Continue look up for a better connection */
          continue;
        }
#endif
        if(canmultiplex) {
          /* We can multiplex if we want to. Let's continue looking for
             the optimal connection to use. */

          if(!multiplexed) {
            /* We have the optimal connection. Let's stop looking. */
            chosen = check;
            break;
          }

#ifdef USE_NGHTTP2
          /* If multiplexed, make sure we don't go over concurrency limit */
          if(check->bits.multiplex) {
            /* Multiplexed connections can only be HTTP/2 for now */
            struct http_conn *httpc = &check->proto.httpc;
            if(multiplexed >= httpc->settings.max_concurrent_streams) {
              infof(data, "MAX_CONCURRENT_STREAMS reached, skip (%zu)",
                    multiplexed);
              continue;
            }
            else if(multiplexed >=
                    Curl_multi_max_concurrent_streams(data->multi)) {
              infof(data, "client side MAX_CONCURRENT_STREAMS reached"
                    ", skip (%zu)",
                    multiplexed);
              continue;
            }
          }
#endif
          /* When not multiplexed, we have a match here! */
          chosen = check;
          infof(data, "Multiplexed connection found");
          break;
        }
        else {
          /* We have found a connection. Let's stop searching. */
          chosen = check;
          break;
        }
      }
    }
  }

  if(chosen) {
    /* mark it as used before releasing the lock */
    Curl_attach_connection(data, chosen);
    CONNCACHE_UNLOCK(data);
    *usethis = chosen;
    return TRUE; /* yes, we found one to use! */
  }
  CONNCACHE_UNLOCK(data);

  if(foundPendingCandidate && data->set.pipewait) {
    infof(data,
          "Found pending candidate for reuse and CURLOPT_PIPEWAIT is set");
    *waitpipe = TRUE;
  }

  return FALSE; /* no matching connecting exists */
}